

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::mouseReleaseEvent(QToolButton *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  QToolButtonPrivate *this_00;
  QMouseEvent *in_RSI;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  QToolButtonPrivate *d;
  QPointer<QAbstractButton> guard;
  QAbstractButton *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QToolButton *)0x70b03e);
  QPointer<QAbstractButton>::QPointer<void>((QPointer<QAbstractButton> *)this_00,in_RDI);
  QAbstractButton::mouseReleaseEvent(this_01,in_RSI);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x70b081);
  if (bVar2) {
    this_00->field_0x2ec = this_00->field_0x2ec & 0xfc;
  }
  QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x70b0a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
    QPointer<QAbstractButton> guard(this);
    QAbstractButton::mouseReleaseEvent(e);
    if (guard)
        d->buttonPressed = QToolButtonPrivate::NoButtonPressed;
}